

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_predict.c
# Opt level: O1

int PredictorVGetField(TIFF *tif,uint32_t tag,__va_list_tag *ap)

{
  undefined2 uVar1;
  uint uVar2;
  uint8_t *puVar3;
  int iVar4;
  undefined8 *puVar5;
  
  puVar3 = tif->tif_data;
  if (puVar3 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_predict.c"
                  ,0x3b9,"int PredictorVGetField(TIFF *, uint32_t, struct __va_list_tag *)");
  }
  if (*(code **)(puVar3 + 0x58) != (code *)0x0) {
    if (tag == 0x13d) {
      uVar1 = *(undefined2 *)puVar3;
      uVar2 = ap->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar5 = (undefined8 *)((ulong)uVar2 + (long)ap->reg_save_area);
        ap->gp_offset = uVar2 + 8;
      }
      else {
        puVar5 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar5 + 1;
      }
      *(undefined2 *)*puVar5 = uVar1;
      return 1;
    }
    iVar4 = (**(code **)(puVar3 + 0x58))();
    return iVar4;
  }
  __assert_fail("sp->vgetparent != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_predict.c"
                ,0x3ba,"int PredictorVGetField(TIFF *, uint32_t, struct __va_list_tag *)");
}

Assistant:

static int PredictorVGetField(TIFF *tif, uint32_t tag, va_list ap)
{
    TIFFPredictorState *sp = PredictorState(tif);

    assert(sp != NULL);
    assert(sp->vgetparent != NULL);

    switch (tag)
    {
        case TIFFTAG_PREDICTOR:
            *va_arg(ap, uint16_t *) = (uint16_t)sp->predictor;
            break;
        default:
            return (*sp->vgetparent)(tif, tag, ap);
    }
    return 1;
}